

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_scandir_empty_dir(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  uv_dirent_t dent;
  uv_fs_t req;
  undefined1 auStack_1d8 [16];
  undefined1 local_1c8 [88];
  long local_170;
  long local_168;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  uv_fs_mkdir(0,local_1c8,"./empty_dir/",0x1ff,0);
  uv_fs_req_cleanup(local_1c8);
  memset(local_1c8,0xdb,0x1b8);
  iVar1 = uv_fs_scandir(0,local_1c8,"./empty_dir/",0,0);
  if (iVar1 == 0) {
    if (local_170 == 0) {
      if (local_168 == 0) {
        iVar1 = uv_fs_scandir_next(local_1c8,auStack_1d8);
        if (iVar1 == -0xfff) {
          uv_fs_req_cleanup(local_1c8);
          iVar1 = uv_fs_scandir(::loop,&scandir_req,"./empty_dir/",0,empty_scandir_cb);
          if (iVar1 == 0) {
            if (scandir_cb_count == 0) {
              uv_run(::loop,0);
              if (scandir_cb_count == 1) {
                uv_fs_rmdir(0,local_1c8,"./empty_dir/",0);
                uv_fs_req_cleanup(local_1c8);
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                uVar2 = 0xa5b;
              }
              else {
                pcVar3 = "scandir_cb_count == 1";
                uVar2 = 0xa56;
              }
            }
            else {
              pcVar3 = "scandir_cb_count == 0";
              uVar2 = 0xa54;
            }
          }
          else {
            pcVar3 = "r == 0";
            uVar2 = 0xa52;
          }
        }
        else {
          pcVar3 = "UV_EOF == uv_fs_scandir_next(&req, &dent)";
          uVar2 = 0xa4e;
        }
      }
      else {
        pcVar3 = "req.ptr == NULL";
        uVar2 = 0xa4d;
      }
    }
    else {
      pcVar3 = "req.result == 0";
      uVar2 = 0xa4c;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0xa4b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_scandir_empty_dir) {
  const char* path;
  uv_fs_t req;
  uv_dirent_t dent;
  int r;

  path = "./empty_dir/";
  loop = uv_default_loop();

  uv_fs_mkdir(NULL, &req, path, 0777, NULL);
  uv_fs_req_cleanup(&req);

  /* Fill the req to ensure that required fields are cleaned up */
  memset(&req, 0xdb, sizeof(req));

  r = uv_fs_scandir(NULL, &req, path, 0, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  ASSERT(req.ptr == NULL);
  ASSERT(UV_EOF == uv_fs_scandir_next(&req, &dent));
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, empty_scandir_cb);
  ASSERT(r == 0);

  ASSERT(scandir_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  uv_fs_rmdir(NULL, &req, path, NULL);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY();
  return 0;
}